

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::SetHoleState(Clipper *this,TEdge *e,OutRec *outrec)

{
  TEdge *pTVar1;
  OutRec *pOVar2;
  byte bVar3;
  TEdge *pTVar4;
  TEdge *pTVar5;
  
  pTVar1 = e->PrevInAEL;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar4 = (TEdge *)0x0;
    do {
      pTVar5 = pTVar4;
      if ((((-1 < pTVar1->OutIdx) && (pTVar1->WindDelta != 0)) &&
          (pTVar5 = pTVar1, pTVar4 != (TEdge *)0x0)) &&
         (pTVar5 = (TEdge *)0x0, pTVar4->OutIdx != pTVar1->OutIdx)) {
        pTVar5 = pTVar4;
      }
      pTVar1 = pTVar1->PrevInAEL;
      pTVar4 = pTVar5;
    } while (pTVar1 != (TEdge *)0x0);
    if (pTVar5 != (TEdge *)0x0) {
      pOVar2 = *(OutRec **)
                (*(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]) +
                (long)pTVar5->OutIdx * 8);
      bVar3 = pOVar2->IsHole ^ 1;
      goto LAB_00111f23;
    }
  }
  pOVar2 = (OutRec *)0x0;
  bVar3 = false;
LAB_00111f23:
  outrec->FirstLeft = pOVar2;
  outrec->IsHole = (bool)bVar3;
  return;
}

Assistant:

void Clipper::SetHoleState(TEdge *e, OutRec *outrec)
{
  TEdge *e2 = e->PrevInAEL;
  TEdge *eTmp = 0;
  while (e2)
  {
    if (e2->OutIdx >= 0 && e2->WindDelta != 0)
    {
      if (!eTmp) eTmp = e2;
      else if (eTmp->OutIdx == e2->OutIdx) eTmp = 0;        
    }
    e2 = e2->PrevInAEL;
  }
  if (!eTmp)
  {
    outrec->FirstLeft = 0;
    outrec->IsHole = false;
  }
  else
  {
    outrec->FirstLeft = m_PolyOuts[eTmp->OutIdx];
    outrec->IsHole = !outrec->FirstLeft->IsHole;
  }
}